

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<iutest::TestEnv::RepeatCountSet,int>
          (string *__return_storage_ptr__,internal *this,RepeatCountSet *value,int *param_2)

{
  iu_global_format_stringstream strm;
  undefined1 local_190 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  TestEnv::get_vars();
  std::ostream::_M_insert<long>((long)(local_190 + 0x10));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}